

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::~ConsoleAssertionPrinter
          (ConsoleAssertionPrinter *this)

{
  long in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *unaff_retaddr;
  
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 0x60));
  std::__cxx11::string::~string((string *)(in_RDI + 0x40));
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  return;
}

Assistant:

ConsoleAssertionPrinter& operator= (ConsoleAssertionPrinter const&) = delete;